

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

Data * __thiscall
QTzTimeZonePrivate::dataFromRule
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,QTzTransitionRule rule,
          qint64 msecsSinceEpoch)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QString::fromUtf8<void>
            ((QString *)&QStack_48,(this->cached_data).m_abbreviations.d.ptr + (rule._8_4_ & 0xff));
  QTimeZonePrivate::Data::Data
            (__return_storage_ptr__,(QString *)&QStack_48,msecsSinceEpoch,
             rule.dstOffset + rule.stdOffset,rule.stdOffset);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::dataFromRule(QTzTransitionRule rule,
                                                        qint64 msecsSinceEpoch) const
{
    return Data(QString::fromUtf8(cached_data.m_abbreviations.at(rule.abbreviationIndex)),
                msecsSinceEpoch, rule.stdOffset + rule.dstOffset, rule.stdOffset);
}